

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

size_t CLI::detail::close_sequence(string *str,size_t start,char closure_char)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  char cVar8;
  char *__data;
  pointer pcVar9;
  string closures;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar3 = matchBracketChars_abi_cxx11_;
  if ((((_DAT_004e53d8 == 0) ||
       (pvVar1 = memchr(matchBracketChars_abi_cxx11_,(int)closure_char,_DAT_004e53d8),
       pvVar1 == (void *)0x0)) || (lVar2 = (long)pvVar1 - (long)pvVar3, lVar2 - 1U < 2)) ||
     (lVar2 == -1)) {
    uVar4 = start + 1;
    uVar5 = str->_M_string_length;
    if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
      pcVar9 = (str->_M_dataplus)._M_p;
      pvVar3 = memchr(pcVar9 + uVar4,(int)closure_char,uVar5 - uVar4);
      sVar6 = (long)pvVar3 - (long)pcVar9;
      if (pvVar3 != (void *)0x0 && sVar6 != 0xffffffffffffffff) {
        return sVar6;
      }
    }
  }
  else if (lVar2 == 0) {
    uVar5 = start + 1;
    if (uVar5 < str->_M_string_length) {
      uVar4 = uVar5;
      do {
        cVar8 = (str->_M_dataplus)._M_p[uVar4];
        if (cVar8 == closure_char) {
          return uVar4;
        }
        if (cVar8 == '\\') {
          uVar4 = start + 2;
        }
        uVar5 = uVar4 + 1;
        start = uVar4;
        uVar4 = uVar5;
      } while (uVar5 < str->_M_string_length);
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 1;
    local_50.field_2._M_local_buf[1] = '\0';
    uVar5 = str->_M_string_length;
    uVar4 = start + 1;
    local_50.field_2._M_local_buf[0] = closure_char;
    if (start + 1 < uVar5) {
      do {
        pcVar9 = (str->_M_dataplus)._M_p;
        cVar8 = pcVar9[uVar4];
        if (cVar8 == local_50._M_dataplus._M_p[local_50._M_string_length - 1]) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                    (&local_50);
          uVar5 = uVar4;
          if (local_50._M_string_length == 0) break;
          pcVar9 = (str->_M_dataplus)._M_p;
          cVar8 = pcVar9[uVar4];
        }
        pvVar3 = bracketChars_abi_cxx11_;
        if (DAT_004e53b8 != 0) {
          pvVar1 = memchr(bracketChars_abi_cxx11_,(int)cVar8,DAT_004e53b8);
          if (pvVar1 != (void *)0x0) {
            lVar2 = (long)pvVar1 - (long)pvVar3;
            if (lVar2 - 1U < 2) {
              uVar4 = start + 2;
              uVar5 = str->_M_string_length;
              if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
                pvVar3 = memchr(pcVar9 + uVar4,(int)cVar8,uVar5 - uVar4);
                uVar4 = (long)pvVar3 - (long)pcVar9;
                if (pvVar3 != (void *)0x0 && (long)pvVar3 - (long)pcVar9 != 0xffffffffffffffff)
                goto LAB_001a8e4d;
              }
              uVar4 = uVar5;
            }
            else if (lVar2 != -1) {
              if (lVar2 == 0) {
                uVar5 = start + 2;
                uVar7 = uVar4;
                while ((uVar4 = uVar5, uVar5 < str->_M_string_length && (pcVar9[uVar5] != cVar8))) {
                  if (pcVar9[uVar5] == '\\') {
                    uVar4 = uVar7 + 2;
                  }
                  uVar7 = uVar4;
                  uVar5 = uVar4 + 1;
                }
              }
              else {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back(&local_50,*(char *)((long)matchBracketChars_abi_cxx11_ + lVar2));
              }
            }
          }
        }
LAB_001a8e4d:
        uVar7 = uVar4 + 1;
        uVar5 = str->_M_string_length;
        start = uVar4;
        uVar4 = uVar7;
      } while (uVar7 < uVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                                 CONCAT11(local_50.field_2._M_local_buf[1],
                                          local_50.field_2._M_local_buf[0])) + 1);
      }
    }
  }
  return uVar5;
}

Assistant:

CLI11_INLINE std::size_t close_sequence(const std::string &str, std::size_t start, char closure_char) {

    auto bracket_loc = matchBracketChars.find(closure_char);
    switch(bracket_loc) {
    case 0:
        return close_string_quote(str, start, closure_char);
    case 1:
    case 2:
    case std::string::npos:
        return close_literal_quote(str, start, closure_char);
    default:
        break;
    }

    std::string closures(1, closure_char);
    auto loc = start + 1;

    while(loc < str.size()) {
        if(str[loc] == closures.back()) {
            closures.pop_back();
            if(closures.empty()) {
                return loc;
            }
        }
        bracket_loc = bracketChars.find(str[loc]);
        if(bracket_loc != std::string::npos) {
            switch(bracket_loc) {
            case 0:
                loc = close_string_quote(str, loc, str[loc]);
                break;
            case 1:
            case 2:
                loc = close_literal_quote(str, loc, str[loc]);
                break;
            default:
                closures.push_back(matchBracketChars[bracket_loc]);
                break;
            }
        }
        ++loc;
    }
    if(loc > str.size()) {
        loc = str.size();
    }
    return loc;
}